

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

AliasRet aa_escape(jit_State *J,IRIns *ir,IRIns *stop)

{
  IRRef ref;
  IRIns *stop_local;
  IRIns *ir_local;
  jit_State *J_local;
  
  stop_local = ir + 1;
  while( true ) {
    if (stop <= stop_local) {
      return ALIAS_NO;
    }
    if (((uint)(stop_local->field_0).op2 == (uint)((long)ir - (long)(J->cur).ir >> 3)) &&
       (((((stop_local->field_1).o == 'J' || ((stop_local->field_1).o == 'K')) ||
         ((stop_local->field_1).o == 'L')) || ((stop_local->field_1).o == 'M')))) break;
    stop_local = stop_local + 1;
  }
  return ALIAS_MAY;
}

Assistant:

static AliasRet aa_escape(jit_State *J, IRIns *ir, IRIns *stop)
{
  IRRef ref = (IRRef)(ir - J->cur.ir);  /* The ref that might be stored. */
  for (ir++; ir < stop; ir++)
    if (ir->op2 == ref &&
	(ir->o == IR_ASTORE || ir->o == IR_HSTORE ||
	 ir->o == IR_USTORE || ir->o == IR_FSTORE))
      return ALIAS_MAY;  /* Reference was stored and might alias. */
  return ALIAS_NO;  /* Reference was not stored. */
}